

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTDMT_compressionJob(void *jobDescription)

{
  pthread_cond_t *__cond;
  ldmState_t *ldmState;
  uint uVar1;
  BYTE *pBVar2;
  undefined1 auVar3 [16];
  ZSTD_customMem customMem;
  int iVar4;
  uint uVar5;
  int iVar6;
  ZSTD_CCtx *cctx;
  ulong uVar8;
  unsigned_long_long *puVar9;
  ulong uVar10;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  pthread_mutex_t *ppVar15;
  void *pvVar16;
  void *dst;
  long lVar17;
  bool bVar18;
  buffer_t buf;
  buffer_t bVar19;
  ZSTD_CCtx_params jobParams;
  ulong local_140;
  undefined8 in_stack_fffffffffffffed0;
  void *src;
  undefined8 in_stack_fffffffffffffed8;
  BYTE *src_00;
  pthread_mutex_t *ppVar20;
  void *in_stack_fffffffffffffee0;
  rawSeqStore_t local_f8;
  size_t local_d8;
  size_t sStack_d0;
  ZSTD_CCtx_params local_c0;
  rawSeq *prVar7;
  
  memcpy(&local_c0,(void *)((long)jobDescription + 200),0x90);
  ppVar15 = *(pthread_mutex_t **)((long)jobDescription + 0x68);
  pthread_mutex_lock(ppVar15);
  iVar4 = *(int *)((long)ppVar15 + 0x2c);
  if ((long)iVar4 == 0) {
    pthread_mutex_unlock(ppVar15);
    customMem.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffed8;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffed0;
    customMem.opaque = in_stack_fffffffffffffee0;
    cctx = ZSTD_createCCtx_advanced(customMem);
    sVar11 = extraout_RDX_00;
  }
  else {
    *(int *)((long)ppVar15 + 0x2c) = iVar4 + -1;
    cctx = *(ZSTD_CCtx **)((long)ppVar15 + (long)iVar4 * 8 + 0x40);
    pthread_mutex_unlock(ppVar15);
    sVar11 = extraout_RDX;
  }
  if ((*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78))->bufferSize == 0) {
    prVar7 = (rawSeq *)0x0;
    uVar14 = 0;
  }
  else {
    bVar19 = ZSTDMT_getBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78));
    prVar7 = (rawSeq *)bVar19.start;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = bVar19.capacity;
    sVar11 = SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
    uVar14 = bVar19.capacity / 0xc;
  }
  sStack_d0 = 0;
  local_d8 = 0;
  if (cctx == (ZSTD_CCtx *)0x0) {
LAB_0016ff46:
    ppVar15 = (pthread_mutex_t *)((long)jobDescription + 0x10);
    pthread_mutex_lock(ppVar15);
    *(undefined8 *)((long)jobDescription + 8) = 0xffffffffffffffc0;
LAB_0016ff5a:
    pthread_mutex_unlock(ppVar15);
  }
  else {
    bVar19.capacity = sVar11;
    bVar19.start = *(void **)((long)jobDescription + 0x88);
    if (*(void **)((long)jobDescription + 0x88) == (void *)0x0) {
      bVar19 = ZSTDMT_getBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x70));
      local_140 = bVar19.capacity;
      if (bVar19.start == (void *)0x0) goto LAB_0016ff46;
      *(buffer_t *)((long)jobDescription + 0x88) = bVar19;
    }
    else {
      local_140 = *(size_t *)((long)jobDescription + 0x90);
    }
    dst = bVar19.start;
    if ((local_c0.ldmParams.enableLdm != 0) && (prVar7 == (rawSeq *)0x0)) goto LAB_0016ff46;
    if (*(int *)((long)jobDescription + 0xb8) != 0) {
      local_c0.fParams.checksumFlag = 0;
    }
    local_c0.ldmParams.enableLdm = 0;
    if (*(ZSTD_CDict **)((long)jobDescription + 0x158) == (ZSTD_CDict *)0x0) {
      bVar18 = *(int *)((long)jobDescription + 0xbc) == 0;
      puVar9 = (unsigned_long_long *)((long)jobDescription + 0x160);
      if (bVar18) {
        puVar9 = (unsigned_long_long *)((long)jobDescription + 0xb0);
      }
      local_c0.forceWindow = (int)bVar18;
      uVar8 = ZSTD_compressBegin_advanced_internal
                        (cctx,*(void **)((long)jobDescription + 0x98),
                         *(size_t *)((long)jobDescription + 0xa0),ZSTD_dct_rawContent,ZSTD_dtlm_fast
                         ,(ZSTD_CDict *)0x0,&local_c0,*puVar9);
      if (uVar8 < 0xffffffffffffff89) goto LAB_0017017a;
LAB_00170657:
      ppVar15 = (pthread_mutex_t *)((long)jobDescription + 0x10);
      pthread_mutex_lock(ppVar15);
      *(ulong *)((long)jobDescription + 8) = uVar8;
      goto LAB_0016ff5a;
    }
    uVar8 = ZSTD_compressBegin_advanced_internal
                      (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,
                       *(ZSTD_CDict **)((long)jobDescription + 0x158),&local_c0,
                       *(unsigned_long_long *)((long)jobDescription + 0x160));
    if (*(int *)((long)jobDescription + 0xbc) == 0) {
      __assert_fail("job->firstJob",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4d07,"void ZSTDMT_compressionJob(void *)");
    }
    if (0xffffffffffffff88 < uVar8) goto LAB_00170657;
LAB_0017017a:
    ppVar15 = *(pthread_mutex_t **)((long)jobDescription + 0x80);
    local_f8.pos = local_d8;
    local_f8.size = sStack_d0;
    src_00 = *(BYTE **)((long)jobDescription + 0xa8);
    uVar8 = *(ulong *)((long)jobDescription + 0xb0);
    uVar1 = *(uint *)((long)jobDescription + 0xb8);
    local_f8.seq = prVar7;
    local_f8.capacity = uVar14;
    pthread_mutex_lock(ppVar15);
    uVar5 = *(uint *)((long)ppVar15 + 0x180);
    if (uVar5 < uVar1) {
      do {
        pthread_cond_wait((pthread_cond_t *)(ppVar15 + 1),ppVar15);
        uVar5 = *(uint *)((long)ppVar15 + 0x180);
      } while (uVar5 < uVar1);
    }
    if (uVar5 == uVar1) {
      if (*(int *)((long)ppVar15 + 0xb8) != 0) {
        if ((((prVar7 == (rawSeq *)0x0) || (local_f8.pos != 0)) || (local_f8.size != 0)) ||
           (uVar14 == 0)) {
          __assert_fail("seqStore.seq != NULL && seqStore.pos == 0 && seqStore.size == 0 && seqStore.capacity > 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4c90,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        if (*(ulong *)((long)ppVar15 + 0xa8) < uVar8) {
          __assert_fail("src.size <= serialState->params.jobSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4c91,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        ldmState = (ldmState_t *)((long)ppVar15 + 0xe8);
        if (uVar8 != 0) {
          lVar13 = ppVar15[6].__align;
          if (lVar13 == 0) {
            __assert_fail("window->base != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2226,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
          }
          if (*(long *)((long)ppVar15 + 0xf8) == 0) {
            __assert_fail("window->dictBase != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2227,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
          }
          pBVar2 = (ldmState->window).nextSrc;
          if (pBVar2 != src_00) {
            uVar10 = (long)pBVar2 - lVar13;
            iVar4 = *(int *)((long)ppVar15 + 0x100);
            *(int *)((long)ppVar15 + 0x104) = iVar4;
            if (uVar10 >> 0x20 != 0) {
              __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x222e,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)")
              ;
            }
            iVar6 = (int)uVar10;
            *(int *)((long)ppVar15 + 0x100) = iVar6;
            *(long *)((long)ppVar15 + 0xf8) = lVar13;
            ppVar15[6].__align = (long)src_00 - uVar10;
            if ((uint)(iVar6 - iVar4) < 8) {
              *(int *)((long)ppVar15 + 0x104) = iVar6;
            }
          }
          pBVar2 = src_00 + uVar8;
          *(BYTE **)((long)ppVar15 + 0xe8) = pBVar2;
          lVar13 = *(long *)((long)ppVar15 + 0xf8);
          uVar1 = *(uint *)((long)ppVar15 + 0x100);
          if (src_00 < (BYTE *)(lVar13 + (ulong)uVar1) &&
              (BYTE *)((ulong)*(uint *)((long)ppVar15 + 0x104) + lVar13) < pBVar2) {
            uVar5 = (uint)((long)pBVar2 - lVar13);
            if ((long)(ulong)uVar1 < (long)pBVar2 - lVar13) {
              uVar5 = uVar1;
            }
            *(uint *)((long)ppVar15 + 0x104) = uVar5;
          }
        }
        sVar11 = ZSTD_ldm_generateSequences
                           (ldmState,&local_f8,(ldmParams_t *)((long)ppVar15 + 0xb8),src_00,uVar8);
        if (0xffffffffffffff88 < sVar11) {
          __assert_fail("!ZSTD_isError(error)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4c97,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        pthread_mutex_lock((pthread_mutex_t *)((long)ppVar15 + 0x188));
        ppVar15[0xc].__align = (long)(ldmState->window).nextSrc;
        *(long *)((long)ppVar15 + 0x1e8) = ppVar15[6].__align;
        *(undefined8 *)((long)ppVar15 + 0x1f0) = *(undefined8 *)((long)ppVar15 + 0xf8);
        *(undefined8 *)((long)ppVar15 + 0x1f8) = *(undefined8 *)((long)ppVar15 + 0x100);
        pthread_cond_signal((pthread_cond_t *)((long)ppVar15 + 0x1b0));
        pthread_mutex_unlock((pthread_mutex_t *)((long)ppVar15 + 0x188));
      }
      if (uVar8 != 0 && *(int *)((long)ppVar15 + 0x7c) != 0) {
        ZSTD_XXH64_update((XXH64_state_t *)((long)ppVar15 + 0x128),src_00,uVar8);
      }
    }
    *(int *)((long)ppVar15 + 0x180) = *(int *)((long)ppVar15 + 0x180) + 1;
    pthread_cond_broadcast((pthread_cond_t *)(ppVar15 + 1));
    pthread_mutex_unlock(ppVar15);
    if (local_f8.size != 0) {
      if ((cctx->stage == ZSTDcs_init) && ((cctx->appliedParams).ldmParams.enableLdm == 0)) {
        (cctx->externSeqStore).seq = local_f8.seq;
        (cctx->externSeqStore).size = local_f8.size;
        (cctx->externSeqStore).capacity = local_f8.size;
        (cctx->externSeqStore).pos = 0;
        bVar18 = true;
      }
      else {
        bVar18 = false;
      }
      if (*(int *)((long)ppVar15 + 0xb8) == 0) {
        __assert_fail("serialState->params.ldmParams.enableLdm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4cab,
                      "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                     );
      }
      if (!bVar18) {
        __assert_fail("!ZSTD_isError(err)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4cac,
                      "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                     );
      }
    }
    if (*(int *)((long)jobDescription + 0xbc) != 0) {
LAB_0017046f:
      if (0x7ffffffe < *(ulong *)((long)jobDescription + 0xb0) >> 0x13) {
        __assert_fail("job->src.size < ((size_t)INT_MAX) * chunkSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4d28,"void ZSTDMT_compressionJob(void *)");
      }
      if (*(long *)((long)jobDescription + 8) != 0) {
        __assert_fail("job->cSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4d2a,"void ZSTDMT_compressionJob(void *)");
      }
      uVar8 = *(ulong *)((long)jobDescription + 0xb0) + 0x7ffff >> 0x13;
      pvVar16 = (void *)(local_140 + (long)dst);
      src = *(void **)((long)jobDescription + 0xa8);
      iVar4 = (int)uVar8;
      if (1 < iVar4) {
        __cond = (pthread_cond_t *)((long)jobDescription + 0x38);
        lVar13 = uVar8 - 1;
        lVar17 = 0x80000;
        local_140 = 0;
        ppVar15 = (pthread_mutex_t *)((long)jobDescription + 0x10);
        do {
          sVar11 = ZSTD_compressContinue_internal
                             (cctx,dst,(long)pvVar16 - (long)dst,src,0x80000,1,0);
          ppVar20 = ppVar15;
          if (sVar11 < 0xffffffffffffff89) {
            dst = (void *)((long)dst + sVar11);
            if (pvVar16 <= dst) {
              __assert_fail("op < oend",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4d2f,"void ZSTDMT_compressionJob(void *)");
            }
            src = (void *)((long)src + 0x80000);
            pthread_mutex_lock(ppVar15);
            *(long *)((long)jobDescription + 8) = *(long *)((long)jobDescription + 8) + sVar11;
            *(long *)jobDescription = lVar17;
            pthread_cond_signal(__cond);
          }
          else {
            pthread_mutex_lock(ppVar15);
            *(size_t *)((long)jobDescription + 8) = sVar11;
          }
          pthread_mutex_unlock(ppVar15);
          if (0xffffffffffffff88 < sVar11) goto LAB_0016ff6b;
          lVar17 = lVar17 + 0x80000;
          lVar13 = lVar13 + -1;
          ppVar15 = ppVar20;
        } while (lVar13 != 0);
      }
      if (iVar4 < 1 && (int)*(long *)((long)jobDescription + 0xc0) == 0) {
        local_140 = 0;
        goto LAB_0016ff6b;
      }
      uVar8 = *(ulong *)((long)jobDescription + 0xb0);
      uVar12 = (ulong)((uint)uVar8 & 0x7ffff);
      uVar10 = uVar12;
      if ((uVar8 & 0x7ffff) == 0) {
        uVar10 = 0x80000;
      }
      if (uVar8 < 0x80000) {
        uVar10 = uVar12;
      }
      if ((int)*(long *)((long)jobDescription + 0xc0) == 0) {
        uVar8 = ZSTD_compressContinue_internal(cctx,dst,(long)pvVar16 - (long)dst,src,uVar10,1,0);
      }
      else {
        uVar8 = ZSTD_compressEnd(cctx,dst,(long)pvVar16 - (long)dst,src,uVar10);
      }
      local_140 = uVar8;
      if (uVar8 < 0xffffffffffffff89) goto LAB_0016ff6b;
      goto LAB_00170657;
    }
    sVar11 = ZSTD_compressContinue_internal
                       (cctx,dst,local_140,*(void **)((long)jobDescription + 0xa8),0,1,0);
    if (sVar11 < 0xffffffffffffff89) {
      ZSTD_invalidateRepCodes(cctx);
      goto LAB_0017046f;
    }
    pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
    *(size_t *)((long)jobDescription + 8) = sVar11;
    pthread_mutex_unlock((pthread_mutex_t *)((long)jobDescription + 0x10));
  }
  local_140 = 0;
LAB_0016ff6b:
  uVar8 = *(ulong *)((long)jobDescription + 8);
  ppVar15 = *(pthread_mutex_t **)((long)jobDescription + 0x80);
  uVar1 = *(uint *)((long)jobDescription + 0xb8);
  pthread_mutex_lock(ppVar15);
  if (*(uint *)((long)ppVar15 + 0x180) <= uVar1) {
    if (uVar8 < 0xffffffffffffff89) {
      __assert_fail("ZSTD_isError(cSize)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4cb6,
                    "void ZSTDMT_serialState_ensureFinished(serialState_t *, unsigned int, size_t)")
      ;
    }
    *(uint *)((long)ppVar15 + 0x180) = uVar1 + 1;
    pthread_cond_broadcast((pthread_cond_t *)(ppVar15 + 1));
    pthread_mutex_lock((pthread_mutex_t *)((long)ppVar15 + 0x188));
    iVar4 = ppVar15[0xc].__data.__lock - *(int *)((long)ppVar15 + 0x1e8);
    *(int *)((long)ppVar15 + 0x1fc) = iVar4;
    *(int *)((long)ppVar15 + 0x1f8) = iVar4;
    pthread_cond_signal((pthread_cond_t *)((long)ppVar15 + 0x1b0));
    pthread_mutex_unlock((pthread_mutex_t *)((long)ppVar15 + 0x188));
  }
  pthread_mutex_unlock(ppVar15);
  buf.capacity = uVar14 * 0xc;
  buf.start = prVar7;
  ZSTDMT_releaseBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78),buf);
  if (cctx != (ZSTD_CCtx *)0x0) {
    ppVar15 = *(pthread_mutex_t **)((long)jobDescription + 0x68);
    pthread_mutex_lock(ppVar15);
    iVar4 = *(int *)((long)ppVar15 + 0x2c);
    if (iVar4 < ppVar15[1].__data.__lock) {
      *(int *)((long)ppVar15 + 0x2c) = iVar4 + 1;
      *(ZSTD_CCtx **)((long)ppVar15 + (long)iVar4 * 8 + 0x48) = cctx;
    }
    else {
      ZSTD_freeCCtx(cctx);
    }
    pthread_mutex_unlock(ppVar15);
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
  if (local_140 == 0 || *(ulong *)((long)jobDescription + 8) < 0xffffffffffffff89) {
    *(ulong *)((long)jobDescription + 8) = *(ulong *)((long)jobDescription + 8) + local_140;
    *(long *)jobDescription = *(long *)((long)jobDescription + 0xb0);
    pthread_cond_signal((pthread_cond_t *)((long)jobDescription + 0x38));
    pthread_mutex_unlock((pthread_mutex_t *)((long)jobDescription + 0x10));
    return;
  }
  __assert_fail("lastCBlockSize == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x4d50,"void ZSTDMT_compressionJob(void *)");
}

Assistant:

static void ZSTDMT_compressionJob(void* jobDescription)
{
    ZSTDMT_jobDescription* const job = (ZSTDMT_jobDescription*)jobDescription;
    ZSTD_CCtx_params jobParams = job->params;   /* do not modify job->params ! copy it, modify the copy */
    ZSTD_CCtx* const cctx = ZSTDMT_getCCtx(job->cctxPool);
    rawSeqStore_t rawSeqStore = ZSTDMT_getSeq(job->seqPool);
    buffer_t dstBuff = job->dstBuff;
    size_t lastCBlockSize = 0;

    /* resources */
    if (cctx==NULL) JOB_ERROR(ERROR(memory_allocation));
    if (dstBuff.start == NULL) {   /* streaming job : doesn't provide a dstBuffer */
        dstBuff = ZSTDMT_getBuffer(job->bufPool);
        if (dstBuff.start==NULL) JOB_ERROR(ERROR(memory_allocation));
        job->dstBuff = dstBuff;   /* this value can be read in ZSTDMT_flush, when it copies the whole job */
    }
    if (jobParams.ldmParams.enableLdm && rawSeqStore.seq == NULL)
        JOB_ERROR(ERROR(memory_allocation));

    /* Don't compute the checksum for chunks, since we compute it externally,
     * but write it in the header.
     */
    if (job->jobID != 0) jobParams.fParams.checksumFlag = 0;
    /* Don't run LDM for the chunks, since we handle it externally */
    jobParams.ldmParams.enableLdm = 0;


    /* init */
    if (job->cdict) {
        size_t const initError = ZSTD_compressBegin_advanced_internal(cctx, NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast, job->cdict, &jobParams, job->fullFrameSize);
        assert(job->firstJob);  /* only allowed for first job */
        if (ZSTD_isError(initError)) JOB_ERROR(initError);
    } else {  /* srcStart points at reloaded section */
        U64 const pledgedSrcSize = job->firstJob ? job->fullFrameSize : job->src.size;
        {   size_t const forceWindowError = ZSTD_CCtxParams_setParameter(&jobParams, ZSTD_c_forceMaxWindow, !job->firstJob);
            if (ZSTD_isError(forceWindowError)) JOB_ERROR(forceWindowError);
        }
        {   size_t const initError = ZSTD_compressBegin_advanced_internal(cctx,
                                        job->prefix.start, job->prefix.size, ZSTD_dct_rawContent, /* load dictionary in "content-only" mode (no header analysis) */
                                        ZSTD_dtlm_fast,
                                        NULL, /*cdict*/
                                        &jobParams, pledgedSrcSize);
            if (ZSTD_isError(initError)) JOB_ERROR(initError);
    }   }

    /* Perform serial step as early as possible, but after CCtx initialization */
    ZSTDMT_serialState_update(job->serial, cctx, rawSeqStore, job->src, job->jobID);

    if (!job->firstJob) {  /* flush and overwrite frame header when it's not first job */
        size_t const hSize = ZSTD_compressContinue(cctx, dstBuff.start, dstBuff.capacity, job->src.start, 0);
        if (ZSTD_isError(hSize)) JOB_ERROR(hSize);
        DEBUGLOG(5, "ZSTDMT_compressionJob: flush and overwrite %u bytes of frame header (not first job)", (U32)hSize);
        ZSTD_invalidateRepCodes(cctx);
    }

    /* compress */
    {   size_t const chunkSize = 4*ZSTD_BLOCKSIZE_MAX;
        int const nbChunks = (int)((job->src.size + (chunkSize-1)) / chunkSize);
        const BYTE* ip = (const BYTE*) job->src.start;
        BYTE* const ostart = (BYTE*)dstBuff.start;
        BYTE* op = ostart;
        BYTE* oend = op + dstBuff.capacity;
        int chunkNb;
        if (sizeof(size_t) > sizeof(int)) assert(job->src.size < ((size_t)INT_MAX) * chunkSize);   /* check overflow */
        DEBUGLOG(5, "ZSTDMT_compressionJob: compress %u bytes in %i blocks", (U32)job->src.size, nbChunks);
        assert(job->cSize == 0);
        for (chunkNb = 1; chunkNb < nbChunks; chunkNb++) {
            size_t const cSize = ZSTD_compressContinue(cctx, op, oend-op, ip, chunkSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            ip += chunkSize;
            op += cSize; assert(op < oend);
            /* stats */
            ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
            job->cSize += cSize;
            job->consumed = chunkSize * chunkNb;
            DEBUGLOG(5, "ZSTDMT_compressionJob: compress new block : cSize==%u bytes (total: %u)",
                        (U32)cSize, (U32)job->cSize);
            ZSTD_pthread_cond_signal(&job->job_cond);   /* warns some more data is ready to be flushed */
            ZSTD_pthread_mutex_unlock(&job->job_mutex);
        }
        /* last block */
        assert(chunkSize > 0);
        assert((chunkSize & (chunkSize - 1)) == 0);  /* chunkSize must be power of 2 for mask==(chunkSize-1) to work */
        if ((nbChunks > 0) | job->lastJob /*must output a "last block" flag*/ ) {
            size_t const lastBlockSize1 = job->src.size & (chunkSize-1);
            size_t const lastBlockSize = ((lastBlockSize1==0) & (job->src.size>=chunkSize)) ? chunkSize : lastBlockSize1;
            size_t const cSize = (job->lastJob) ?
                 ZSTD_compressEnd     (cctx, op, oend-op, ip, lastBlockSize) :
                 ZSTD_compressContinue(cctx, op, oend-op, ip, lastBlockSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            lastCBlockSize = cSize;
    }   }

_endJob:
    ZSTDMT_serialState_ensureFinished(job->serial, job->jobID, job->cSize);
    if (job->prefix.size > 0)
        DEBUGLOG(5, "Finished with prefix: %zx", (size_t)job->prefix.start);
    DEBUGLOG(5, "Finished with source: %zx", (size_t)job->src.start);
    /* release resources */
    ZSTDMT_releaseSeq(job->seqPool, rawSeqStore);
    ZSTDMT_releaseCCtx(job->cctxPool, cctx);
    /* report */
    ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
    if (ZSTD_isError(job->cSize)) assert(lastCBlockSize == 0);
    job->cSize += lastCBlockSize;
    job->consumed = job->src.size;  /* when job->consumed == job->src.size , compression job is presumed completed */
    ZSTD_pthread_cond_signal(&job->job_cond);
    ZSTD_pthread_mutex_unlock(&job->job_mutex);
}